

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_func_num_args(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  VmFrame *pVVar1;
  sxu32 iValue;
  
  pVVar1 = pCtx->pVm->pFrame;
  if (pVVar1->pParent == (VmFrame *)0x0) {
    iValue = 0xffffffff;
  }
  else {
    iValue = (pVVar1->sArg).nUsed;
  }
  jx9_result_int(pCtx,iValue);
  return 0;
}

Assistant:

static int vm_builtin_func_num_args(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	VmFrame *pFrame;
	jx9_vm *pVm;
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Current frame */
	pFrame = pVm->pFrame;
	if( pFrame->pParent == 0 ){
		SXUNUSED(nArg);
		SXUNUSED(apArg);
		/* Global frame, return -1 */
		jx9_result_int(pCtx, -1);
		return SXRET_OK;
	}
	/* Total number of arguments passed to the enclosing function */
	nArg = (int)SySetUsed(&pFrame->sArg);
	jx9_result_int(pCtx, nArg);
	return SXRET_OK;
}